

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O2

void __thiscall
ncnn::Pooling1D::make_padding
          (Pooling1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  float v;
  Option opt_b;
  Option local_68;
  
  iVar6 = bottom_blob->w;
  if (bottom_blob_bordered != bottom_blob) {
    piVar1 = bottom_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = bottom_blob_bordered->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (bottom_blob_bordered->allocator == (Allocator *)0x0) {
          free(bottom_blob_bordered->data);
        }
        else {
          (*bottom_blob_bordered->allocator->_vptr_Allocator[3])();
        }
      }
    }
    bottom_blob_bordered->cstep = 0;
    bottom_blob_bordered->data = (void *)0x0;
    bottom_blob_bordered->refcount = (int *)0x0;
    *(undefined8 *)((long)&bottom_blob_bordered->refcount + 4) = 0;
    *(undefined8 *)((long)&bottom_blob_bordered->elemsize + 4) = 0;
    bottom_blob_bordered->c = 0;
    bottom_blob_bordered->dims = 0;
    bottom_blob_bordered->w = 0;
    bottom_blob_bordered->h = 0;
    bottom_blob_bordered->d = 0;
    piVar1 = bottom_blob->refcount;
    bottom_blob_bordered->data = bottom_blob->data;
    bottom_blob_bordered->refcount = piVar1;
    bottom_blob_bordered->elemsize = bottom_blob->elemsize;
    bottom_blob_bordered->elempack = bottom_blob->elempack;
    bottom_blob_bordered->allocator = bottom_blob->allocator;
    iVar4 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    iVar3 = bottom_blob->d;
    bottom_blob_bordered->dims = bottom_blob->dims;
    bottom_blob_bordered->w = iVar4;
    bottom_blob_bordered->h = iVar2;
    bottom_blob_bordered->d = iVar3;
    bottom_blob_bordered->c = bottom_blob->c;
    bottom_blob_bordered->cstep = bottom_blob->cstep;
  }
  v = 0.0;
  if (this->pooling_type == 0) {
    v = *(float *)(&DAT_0053da00 + (ulong)(bottom_blob->elemsize == 1) * 4);
  }
  switch(this->pad_mode) {
  case 0:
    uVar5 = this->pad_left;
    iVar4 = (int)((iVar6 + uVar5 + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar6 = this->stride_w - iVar4;
    if (iVar4 == 0) {
      iVar6 = 0;
    }
    local_68.lightmode = opt->lightmode;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_ops = opt->use_subgroup_ops;
    local_68.use_reserved_0 = opt->use_reserved_0;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.vulkan_device_index = opt->vulkan_device_index;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_shader_local_memory = opt->use_shader_local_memory;
    local_68.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_68.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_68.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_68.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_68.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_68.use_fp16_uniform = opt->use_fp16_uniform;
    local_68.use_int8_uniform = opt->use_int8_uniform;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar7 = iVar6 + this->pad_right;
    break;
  case 1:
    local_68.lightmode = opt->lightmode;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_ops = opt->use_subgroup_ops;
    local_68.use_reserved_0 = opt->use_reserved_0;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.vulkan_device_index = opt->vulkan_device_index;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_shader_local_memory = opt->use_shader_local_memory;
    local_68.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_68.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_68.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_68.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_68.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_68.use_fp16_uniform = opt->use_fp16_uniform;
    local_68.use_int8_uniform = opt->use_int8_uniform;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar5 = this->pad_left;
    uVar7 = this->pad_right;
    break;
  case 2:
    uVar7 = ~((iVar6 + -1) % this->stride_w) + this->kernel_w;
    if ((int)uVar7 < 1) {
      return;
    }
    local_68.lightmode = opt->lightmode;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_ops = opt->use_subgroup_ops;
    local_68.use_reserved_0 = opt->use_reserved_0;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.vulkan_device_index = opt->vulkan_device_index;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_shader_local_memory = opt->use_shader_local_memory;
    local_68.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_68.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_68.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_68.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_68.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_68.use_fp16_uniform = opt->use_fp16_uniform;
    local_68.use_int8_uniform = opt->use_int8_uniform;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar5 = uVar7 >> 1;
    uVar7 = uVar7 - uVar5;
    break;
  case 3:
    uVar5 = ~((iVar6 + -1) % this->stride_w) + this->kernel_w;
    if ((int)uVar5 < 1) {
      return;
    }
    local_68.lightmode = opt->lightmode;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_ops = opt->use_subgroup_ops;
    local_68.use_reserved_0 = opt->use_reserved_0;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.vulkan_device_index = opt->vulkan_device_index;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_shader_local_memory = opt->use_shader_local_memory;
    local_68.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_68.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_68.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_68.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_68.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_68.use_fp16_uniform = opt->use_fp16_uniform;
    local_68.use_int8_uniform = opt->use_int8_uniform;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar7 = uVar5 >> 1;
    uVar5 = uVar5 - uVar7;
    break;
  default:
    goto switchD_004d7e4b_default;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,0,0,uVar5,uVar7,0,v,&local_68);
switchD_004d7e4b_default:
  return;
}

Assistant:

void Pooling1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;

        if (wtail != 0)
            wtailpad = stride_w - wtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}